

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O3

void uss_opendir(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path)

{
  int iVar1;
  char *__name;
  DIR *pDVar2;
  int *e;
  int *piVar3;
  SftpReplyBuilder *reply_00;
  
  reply_00 = (SftpReplyBuilder *)path.len;
  __name = mkstr(path);
  pDVar2 = opendir(__name);
  free(__name);
  if (pDVar2 == (DIR *)0x0) {
    uss_error((UnixSftpServer *)reply,reply_00);
    return;
  }
  e = (int *)safemalloc(1,0x10,0);
  iVar1 = *(int *)&srv[-2].vt;
  *(int *)&srv[-2].vt = iVar1 + 1;
  *e = iVar1;
  *(DIR **)(e + 2) = pDVar2;
  piVar3 = (int *)add234((tree234 *)srv[-3].vt,e);
  if (piVar3 == e) {
    uss_return_handle_raw((UnixSftpServer *)(srv + -6),reply,*e,0xffffffff);
    return;
  }
  __assert_fail("added == udh",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sftpserver.c"
                ,0xa5,"void uss_return_new_dirhandle(UnixSftpServer *, SftpReplyBuilder *, DIR *)");
}

Assistant:

static void uss_opendir(SftpServer *srv, SftpReplyBuilder *reply,
                        ptrlen path)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    char *pathstr = mkstr(path);
    DIR *dp = opendir(pathstr);
    free(pathstr);

    if (!dp) {
        uss_error(uss, reply);
    } else {
        uss_return_new_dirhandle(uss, reply, dp);
    }
}